

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *input,string *edible)

{
  long lVar1;
  allocator<char> local_21;
  
  lVar1 = std::__cxx11::string::find_first_not_of((string *)input,(ulong)edible);
  std::__cxx11::string::find_last_not_of((string *)input,(ulong)edible);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim (const std::string& input, const std::string& edible)
{
  auto start = input.find_first_not_of (edible);
  auto end   = input.find_last_not_of  (edible);

  if (start == std::string::npos)
    return "";

  if (end == std::string::npos)
    return input.substr (start);

  return input.substr (start, end - start + 1);
}